

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison.h
# Opt level: O0

bool Compare<std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,Comparison cmp
               )

{
  Comparison cmp_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  
  switch(cmp) {
  case Less:
    lhs_local._7_1_ = std::operator<(lhs,rhs);
    break;
  case LessOrEqual:
    lhs_local._7_1_ = std::operator<=(lhs,rhs);
    break;
  case Greater:
    lhs_local._7_1_ = std::operator>(lhs,rhs);
    break;
  case GreaterOrEqual:
    lhs_local._7_1_ = std::operator>=(lhs,rhs);
    break;
  case Equal:
    lhs_local._7_1_ = std::operator==(lhs,rhs);
    break;
  case NotEqual:
    lhs_local._7_1_ = std::operator!=(lhs,rhs);
    break;
  default:
    lhs_local._7_1_ = true;
  }
  return lhs_local._7_1_;
}

Assistant:

bool Compare(ValueType lhs, ValueType rhs, Comparison cmp) {
    switch (cmp) {
    case Comparison::Less:
        return lhs < rhs;
    case Comparison::LessOrEqual:
        return lhs <= rhs;
    case Comparison::Greater:
        return lhs > rhs;
    case Comparison::GreaterOrEqual:
        return lhs >= rhs;
    case Comparison::Equal:
        return lhs == rhs;
    case Comparison::NotEqual:
        return lhs != rhs;
    default:
        return true;
    }
}